

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLogTestCase.cpp
# Opt level: O0

void anon_unknown.dwarf_18dedb::deleteLogSession(string *sender,string *target)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *target_local;
  string *sender_local;
  
  local_18 = target;
  target_local = sender;
  std::operator+(&local_98,"log/FIX.4.2-",sender);
  std::operator+(&local_78,&local_98,"-");
  std::operator+(&local_58,&local_78,target);
  std::operator+(&local_38,&local_58,".event.current.log");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::operator+(&local_128,"log/backup/FIX.4.2-",sender);
  std::operator+(&local_108,&local_128,"-");
  std::operator+(&local_e8,&local_108,target);
  std::operator+(&local_c8,&local_e8,".event.backup.1.log");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::operator+(&local_1a8,"log/backup/FIX.4.2-",sender);
  std::operator+(&local_188,&local_1a8,"-");
  std::operator+(&local_168,&local_188,target);
  std::operator+(&local_148,&local_168,".event.backup.2.log");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::operator+(&local_228,"log/backup/FIX.4.2-",sender);
  std::operator+(&local_208,&local_228,"-");
  std::operator+(&local_1e8,&local_208,target);
  std::operator+(&local_1c8,&local_1e8,".event.backup.3.log");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::operator+(&local_2a8,"log/backup/FIX.4.2-",sender);
  std::operator+(&local_288,&local_2a8,"-");
  std::operator+(&local_268,&local_288,target);
  std::operator+(&local_248,&local_268,".event.backup.4.log");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::operator+(&local_328,"log/backup/FIX.4.2-",sender);
  std::operator+(&local_308,&local_328,"-");
  std::operator+(&local_2e8,&local_308,target);
  std::operator+(&local_2c8,&local_2e8,".event.backup.5.log");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  std::operator+(&local_3a8,"log/FIX.4.2-",sender);
  std::operator+(&local_388,&local_3a8,"-");
  std::operator+(&local_368,&local_388,target);
  std::operator+(&local_348,&local_368,".messages.current.log");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::operator+(&local_428,"log/backup/FIX.4.2-",sender);
  std::operator+(&local_408,&local_428,"-");
  std::operator+(&local_3e8,&local_408,target);
  std::operator+(&local_3c8,&local_3e8,".messages.backup.1.log");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::operator+(&local_4a8,"log/backup/FIX.4.2-",sender);
  std::operator+(&local_488,&local_4a8,"-");
  std::operator+(&local_468,&local_488,target);
  std::operator+(&local_448,&local_468,".messages.backup.2.log");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::operator+(&local_528,"log/backup/FIX.4.2-",sender);
  std::operator+(&local_508,&local_528,"-");
  std::operator+(&local_4e8,&local_508,target);
  std::operator+(&local_4c8,&local_4e8,".messages.backup.3.log");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_528);
  std::operator+(&local_5a8,"log/backup/FIX.4.2-",sender);
  std::operator+(&local_588,&local_5a8,"-");
  std::operator+(&local_568,&local_588,target);
  std::operator+(&local_548,&local_568,".messages.backup.4.log");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::operator+(&local_628,"log/backup/FIX.4.2-",sender);
  std::operator+(&local_608,&local_628,"-");
  std::operator+(&local_5e8,&local_608,target);
  std::operator+(&local_5c8,&local_5e8,".messages.backup.5.log");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_628);
  return;
}

Assistant:

inline void deleteLogSession(std::string sender, std::string target) {
  file_unlink(("log/FIX.4.2-" + sender + "-" + target + ".event.current.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".event.backup.1.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".event.backup.2.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".event.backup.3.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".event.backup.4.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".event.backup.5.log").c_str());

  file_unlink(("log/FIX.4.2-" + sender + "-" + target + ".messages.current.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".messages.backup.1.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".messages.backup.2.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".messages.backup.3.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".messages.backup.4.log").c_str());

  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".messages.backup.5.log").c_str());
}